

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSModel.cpp
# Opt level: O0

XSElementDeclaration * __thiscall
xercesc_4_0::XSModel::getElementDeclaration(XSModel *this,XMLCh *name,XMLCh *compNamespace)

{
  XSNamespaceItem *local_30;
  XSNamespaceItem *namespaceItem;
  XMLCh *compNamespace_local;
  XMLCh *name_local;
  XSModel *this_local;
  
  if (compNamespace == (XMLCh *)0x0) {
    local_30 = getNamespaceItem(this,L"");
  }
  else {
    local_30 = getNamespaceItem(this,compNamespace);
  }
  if (local_30 == (XSNamespaceItem *)0x0) {
    this_local = (XSModel *)0x0;
  }
  else {
    this_local = (XSModel *)XSNamespaceItem::getElementDeclaration(local_30,name);
  }
  return (XSElementDeclaration *)this_local;
}

Assistant:

XSElementDeclaration *XSModel::getElementDeclaration(const XMLCh *name
            , const XMLCh *compNamespace)
{
    XSNamespaceItem* namespaceItem;
    if (compNamespace)
        namespaceItem = getNamespaceItem(compNamespace);
    else
        namespaceItem = getNamespaceItem(XMLUni::fgZeroLenString);

    if (namespaceItem)
        return namespaceItem->getElementDeclaration(name);

    return 0;
}